

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtzone.cpp
# Opt level: O3

void __thiscall
icu_63::VTimeZone::beginZoneProps
          (VTimeZone *this,VTZWriter *writer,UBool isDst,UnicodeString *zonename,int32_t fromOffset,
          int32_t toOffset,UDate startTime,UErrorCode *status)

{
  short sVar1;
  undefined4 uVar2;
  int32_t srcLength;
  UnicodeString dstr;
  UChar local_13a;
  UnicodeString local_138;
  UDate local_f8;
  undefined6 *local_f0;
  undefined1 *local_e0;
  undefined6 *local_d0;
  undefined1 *local_c0;
  undefined6 *local_b0;
  undefined1 *local_a0;
  undefined6 *local_90;
  undefined1 *local_80;
  undefined6 *local_70;
  undefined1 *local_60;
  undefined1 *local_50;
  undefined1 *local_40;
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    local_f8 = startTime;
    UnicodeString::doAppend(writer->out,(UChar *)ICAL_BEGIN,0,-1);
    local_40 = ICAL_BEGIN;
    local_138.super_Replaceable.super_UObject._vptr_UObject._0_2_ = 0x3a;
    UnicodeString::doAppend(writer->out,(UChar *)&local_138,0,1);
    if (isDst == '\0') {
      UnicodeString::doAppend(writer->out,(UChar *)ICAL_STANDARD,0,-1);
      local_60 = ICAL_STANDARD;
    }
    else {
      UnicodeString::doAppend(writer->out,(UChar *)ICAL_DAYLIGHT,0,-1);
      local_50 = ICAL_DAYLIGHT;
    }
    UnicodeString::doAppend(writer->out,L"\r\n",0,-1);
    local_70 = &ICAL_NEWLINE;
    local_138.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003f5be0;
    local_138.fUnion.fStackFields.fLengthAndFlags = 2;
    UnicodeString::doAppend(writer->out,(UChar *)ICAL_TZOFFSETTO,0,-1);
    local_80 = ICAL_TZOFFSETTO;
    local_13a = L':';
    UnicodeString::doAppend(writer->out,&local_13a,0,1);
    millisToOffset(toOffset,&local_138);
    uVar2 = local_138.fUnion.fFields.fLength;
    if (-1 < local_138.fUnion.fStackFields.fLengthAndFlags) {
      uVar2 = (int)local_138.fUnion.fStackFields.fLengthAndFlags >> 5;
    }
    UnicodeString::doAppend(writer->out,&local_138,0,uVar2);
    UnicodeString::doAppend(writer->out,L"\r\n",0,-1);
    local_90 = &ICAL_NEWLINE;
    UnicodeString::doAppend(writer->out,(UChar *)ICAL_TZOFFSETFROM,0,-1);
    local_a0 = ICAL_TZOFFSETFROM;
    local_13a = L':';
    UnicodeString::doAppend(writer->out,&local_13a,0,1);
    millisToOffset(fromOffset,&local_138);
    uVar2 = local_138.fUnion.fFields.fLength;
    if (-1 < local_138.fUnion.fStackFields.fLengthAndFlags) {
      uVar2 = (int)local_138.fUnion.fStackFields.fLengthAndFlags >> 5;
    }
    UnicodeString::doAppend(writer->out,&local_138,0,uVar2);
    UnicodeString::doAppend(writer->out,L"\r\n",0,-1);
    local_b0 = &ICAL_NEWLINE;
    UnicodeString::doAppend(writer->out,(UChar *)ICAL_TZNAME,0,-1);
    local_c0 = ICAL_TZNAME;
    local_13a = L':';
    UnicodeString::doAppend(writer->out,&local_13a,0,1);
    sVar1 = (zonename->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      srcLength = (zonename->fUnion).fFields.fLength;
    }
    else {
      srcLength = (int)sVar1 >> 5;
    }
    UnicodeString::doAppend(writer->out,zonename,0,srcLength);
    UnicodeString::doAppend(writer->out,L"\r\n",0,-1);
    local_d0 = &ICAL_NEWLINE;
    UnicodeString::doAppend(writer->out,(UChar *)ICAL_DTSTART,0,-1);
    local_e0 = ICAL_DTSTART;
    local_13a = L':';
    UnicodeString::doAppend(writer->out,&local_13a,0,1);
    getDateTimeString((double)fromOffset + local_f8,&local_138);
    if (-1 < local_138.fUnion.fStackFields.fLengthAndFlags) {
      local_138.fUnion.fFields.fLength = (int)local_138.fUnion.fStackFields.fLengthAndFlags >> 5;
    }
    UnicodeString::doAppend(writer->out,&local_138,0,local_138.fUnion.fFields.fLength);
    UnicodeString::doAppend(writer->out,L"\r\n",0,-1);
    local_f0 = &ICAL_NEWLINE;
    UnicodeString::~UnicodeString(&local_138);
  }
  return;
}

Assistant:

void
VTimeZone::beginZoneProps(VTZWriter& writer, UBool isDst, const UnicodeString& zonename,
                          int32_t fromOffset, int32_t toOffset, UDate startTime, UErrorCode& status) const {
    if (U_FAILURE(status)) {
        return;
    }
    writer.write(ICAL_BEGIN);
    writer.write(COLON);
    if (isDst) {
        writer.write(ICAL_DAYLIGHT);
    } else {
        writer.write(ICAL_STANDARD);
    }
    writer.write(ICAL_NEWLINE);

    UnicodeString dstr;

    // TZOFFSETTO
    writer.write(ICAL_TZOFFSETTO);
    writer.write(COLON);
    millisToOffset(toOffset, dstr);
    writer.write(dstr);
    writer.write(ICAL_NEWLINE);

    // TZOFFSETFROM
    writer.write(ICAL_TZOFFSETFROM);
    writer.write(COLON);
    millisToOffset(fromOffset, dstr);
    writer.write(dstr);
    writer.write(ICAL_NEWLINE);

    // TZNAME
    writer.write(ICAL_TZNAME);
    writer.write(COLON);
    writer.write(zonename);
    writer.write(ICAL_NEWLINE);
    
    // DTSTART
    writer.write(ICAL_DTSTART);
    writer.write(COLON);
    writer.write(getDateTimeString(startTime + fromOffset, dstr));
    writer.write(ICAL_NEWLINE);        
}